

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::RepeatedField_NaturalGrowthOnArenasReuseBlocks_Test::TestBody
          (RepeatedField_NaturalGrowthOnArenasReuseBlocks_Test *this)

{
  RepeatedField<int> *this_00;
  VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::internal::GeMatcher<unsigned_long>,_testing::internal::LeMatcher<double>_>
  matcher;
  bool bVar1;
  int iVar2;
  reference ppRVar3;
  size_type sVar4;
  char *message;
  undefined1 auVar5 [16];
  _Head_base<0UL,_testing::internal::GeMatcher<unsigned_long>,_false> in_stack_fffffffffffffe58;
  AssertHelper local_160;
  Message local_158;
  uint64_t local_150;
  ComparisonBase<testing::internal::LeMatcher<double>,_double,_std::less_equal<void>_> local_148;
  ComparisonBase<testing::internal::GeMatcher<unsigned_long>,_unsigned_long,_std::greater_equal<void>_>
  local_140;
  testing local_138 [8];
  LeMatcher<double> LStack_130;
  char local_128 [16];
  undefined1 local_118 [8];
  AssertionResult gtest_ar;
  size_t expected;
  int j;
  RepeatedField<int> *field;
  RepeatedField<int> *local_e0;
  int local_d4;
  undefined1 local_d0 [4];
  int i;
  vector<google::protobuf::RepeatedField<int>_*,_std::allocator<google::protobuf::RepeatedField<int>_*>_>
  values;
  Arena arena;
  RepeatedField_NaturalGrowthOnArenasReuseBlocks_Test *this_local;
  
  Arena::Arena((Arena *)&values.
                         super__Vector_base<google::protobuf::RepeatedField<int>_*,_std::allocator<google::protobuf::RepeatedField<int>_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<google::protobuf::RepeatedField<int>_*,_std::allocator<google::protobuf::RepeatedField<int>_*>_>
  ::vector((vector<google::protobuf::RepeatedField<int>_*,_std::allocator<google::protobuf::RepeatedField<int>_*>_>
            *)local_d0);
  for (local_d4 = 0; local_d4 < 100; local_d4 = local_d4 + 1) {
    local_e0 = Arena::Create<google::protobuf::RepeatedField<int>>
                         ((Arena *)&values.
                                    super__Vector_base<google::protobuf::RepeatedField<int>_*,_std::allocator<google::protobuf::RepeatedField<int>_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<google::protobuf::RepeatedField<int>_*,_std::allocator<google::protobuf::RepeatedField<int>_*>_>
    ::push_back((vector<google::protobuf::RepeatedField<int>_*,_std::allocator<google::protobuf::RepeatedField<int>_*>_>
                 *)local_d0,&local_e0);
    ppRVar3 = std::
              vector<google::protobuf::RepeatedField<int>_*,_std::allocator<google::protobuf::RepeatedField<int>_*>_>
              ::back((vector<google::protobuf::RepeatedField<int>_*,_std::allocator<google::protobuf::RepeatedField<int>_*>_>
                      *)local_d0);
    this_00 = *ppRVar3;
    for (expected._4_4_ = 0; expected._4_4_ < 1000; expected._4_4_ = expected._4_4_ + 1) {
      RepeatedField<int>::Add(this_00,expected._4_4_);
    }
  }
  sVar4 = std::
          vector<google::protobuf::RepeatedField<int>_*,_std::allocator<google::protobuf::RepeatedField<int>_*>_>
          ::size((vector<google::protobuf::RepeatedField<int>_*,_std::allocator<google::protobuf::RepeatedField<int>_*>_>
                  *)local_d0);
  ppRVar3 = std::
            vector<google::protobuf::RepeatedField<int>_*,_std::allocator<google::protobuf::RepeatedField<int>_*>_>
            ::operator[]((vector<google::protobuf::RepeatedField<int>_*,_std::allocator<google::protobuf::RepeatedField<int>_*>_>
                          *)local_d0,0);
  iVar2 = RepeatedField<int>::Capacity(*ppRVar3);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(sVar4 * (long)iVar2 * 4);
  local_140.rhs_ =
       (unsigned_long)
       testing::Ge<unsigned_long>
                 ((unsigned_long)
                  gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl);
  auVar5._8_4_ = gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._4_4_;
  auVar5._0_8_ = gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
  auVar5._12_4_ = 0x45300000;
  local_148.rhs_ =
       (double)testing::Le<double>(((auVar5._8_8_ - 1.9342813113834067e+25) +
                                   ((double)CONCAT44(0x43300000,
                                                     (int)gtest_ar.message_._M_t.
                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl) - 4503599627370496.0)) * 1.02);
  testing::AllOf<testing::internal::GeMatcher<unsigned_long>,testing::internal::LeMatcher<double>>
            (local_138,(GeMatcher<unsigned_long> *)&local_140,(LeMatcher<double> *)&local_148);
  matcher.matchers_.
  super__Tuple_impl<0UL,_testing::internal::GeMatcher<unsigned_long>,_testing::internal::LeMatcher<double>_>
  .super__Head_base<0UL,_testing::internal::GeMatcher<unsigned_long>,_false>._M_head_impl.
  super_ComparisonBase<testing::internal::GeMatcher<unsigned_long>,_unsigned_long,_std::greater_equal<void>_>
  .rhs_ = in_stack_fffffffffffffe58._M_head_impl.
          super_ComparisonBase<testing::internal::GeMatcher<unsigned_long>,_unsigned_long,_std::greater_equal<void>_>
          .rhs_;
  matcher.matchers_.
  super__Tuple_impl<0UL,_testing::internal::GeMatcher<unsigned_long>,_testing::internal::LeMatcher<double>_>
  .super__Tuple_impl<1UL,_testing::internal::LeMatcher<double>_>.
  super__Head_base<1UL,_testing::internal::LeMatcher<double>,_false>._M_head_impl.
  super_ComparisonBase<testing::internal::LeMatcher<double>,_double,_std::less_equal<void>_>.rhs_ =
       (_Head_base<1UL,_testing::internal::LeMatcher<double>,_false>)
       (_Head_base<1UL,_testing::internal::LeMatcher<double>,_false>)
       LStack_130.
       super_ComparisonBase<testing::internal::LeMatcher<double>,_double,_std::less_equal<void>_>.
       rhs_;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,testing::internal::GeMatcher<unsigned_long>,testing::internal::LeMatcher<double>>>
            (matcher);
  local_150 = Arena::SpaceUsed((Arena *)&values.
                                         super__Vector_base<google::protobuf::RepeatedField<int>_*,_std::allocator<google::protobuf::RepeatedField<int>_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,testing::internal::GeMatcher<unsigned_long>,testing::internal::LeMatcher<double>>>
  ::operator()(local_118,local_128,(unsigned_long *)"arena.SpaceUsed()");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
               ,0xf5,message);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  std::
  vector<google::protobuf::RepeatedField<int>_*,_std::allocator<google::protobuf::RepeatedField<int>_*>_>
  ::~vector((vector<google::protobuf::RepeatedField<int>_*,_std::allocator<google::protobuf::RepeatedField<int>_*>_>
             *)local_d0);
  Arena::~Arena((Arena *)&values.
                          super__Vector_base<google::protobuf::RepeatedField<int>_*,_std::allocator<google::protobuf::RepeatedField<int>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(RepeatedField, NaturalGrowthOnArenasReuseBlocks) {
  Arena arena;
  std::vector<RepeatedField<int>*> values;

  static constexpr int kNumFields = 100;
  static constexpr int kNumElems = 1000;
  for (int i = 0; i < kNumFields; ++i) {
    values.push_back(Arena::Create<RepeatedField<int>>(&arena));
    auto& field = *values.back();
    for (int j = 0; j < kNumElems; ++j) {
      field.Add(j);
    }
  }

  size_t expected = values.size() * values[0]->Capacity() * sizeof(int);
  // Use a 2% slack for other overhead. If we were not reusing the blocks, the
  // actual value would be ~2x the expected.
  EXPECT_THAT(arena.SpaceUsed(), AllOf(Ge(expected), Le(1.02 * expected)));
}